

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O2

void __thiscall QSslSocket::startServerEncryption(QSslSocket *this)

{
  QSslSocketPrivate *this_00;
  TlsCryptograph *pTVar1;
  bool bVar2;
  QLoggingCategory *pQVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_38;
  char *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QSslSocketPrivate **)&(this->super_QTcpSocket).super_QAbstractSocket.field_0x8;
  if (this_00->mode == UnencryptedMode) {
    bVar2 = QSslSocketPrivate::supportsSsl();
    if (bVar2) {
      bVar2 = QSslSocketPrivate::verifyProtocolSupported
                        (this_00,"QSslSocket::startServerEncryption");
      if (bVar2) {
        this_00->mode = SslServerMode;
        modeChanged(this,SslServerMode);
        pTVar1 = (this_00->backend)._M_t.
                 super___uniq_ptr_impl<QTlsPrivate::TlsCryptograph,_std::default_delete<QTlsPrivate::TlsCryptograph>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_QTlsPrivate::TlsCryptograph_*,_std::default_delete<QTlsPrivate::TlsCryptograph>_>
                 .super__Head_base<0UL,_QTlsPrivate::TlsCryptograph_*,_false>._M_head_impl;
        if (pTVar1 != (TlsCryptograph *)0x0) {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
            (**(code **)(*(long *)pTVar1 + 0x88))();
            return;
          }
          goto LAB_002323a1;
        }
      }
    }
    else {
      pQVar3 = QtPrivateLogging::lcSsl();
      if (((pQVar3->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
        local_20 = pQVar3->name;
        local_38.d._0_4_ = 2;
        local_38._4_8_ = 0;
        local_38._12_8_ = 0;
        local_38.size._4_4_ = 0;
        QMessageLogger::warning
                  ((char *)&local_38,"QSslSocket::startServerEncryption: TLS initialization failed")
        ;
      }
      tr((QString *)&local_38,"TLS initialization failed",(char *)0x0,-1);
      QAbstractSocketPrivate::setErrorAndEmit
                ((QAbstractSocketPrivate *)this_00,SslInternalError,(QString *)&local_38);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
    }
  }
  else {
    pQVar3 = QtPrivateLogging::lcSsl();
    if (((pQVar3->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
      local_20 = pQVar3->name;
      local_38.d._0_4_ = 2;
      local_38._4_8_ = 0;
      local_38._12_8_ = 0;
      local_38.size._4_4_ = 0;
      QMessageLogger::warning
                ((char *)&local_38,
                 "QSslSocket::startServerEncryption: cannot start handshake on non-plain connection"
                );
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
LAB_002323a1:
  __stack_chk_fail();
}

Assistant:

void QSslSocket::startServerEncryption()
{
    Q_D(QSslSocket);
    if (d->mode != UnencryptedMode) {
        qCWarning(lcSsl, "QSslSocket::startServerEncryption: cannot start handshake on non-plain connection");
        return;
    }
#ifdef QSSLSOCKET_DEBUG
    qCDebug(lcSsl) << "QSslSocket::startServerEncryption()";
#endif
    if (!supportsSsl()) {
        qCWarning(lcSsl, "QSslSocket::startServerEncryption: TLS initialization failed");
        d->setErrorAndEmit(QAbstractSocket::SslInternalError, tr("TLS initialization failed"));
        return;
    }
    if (!d->verifyProtocolSupported("QSslSocket::startServerEncryption"))
        return;

    d->mode = SslServerMode;
    emit modeChanged(d->mode);
    d->startServerEncryption();
}